

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziptool.c
# Opt level: O1

zip_flags_t get_flags(char *arg)

{
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  uint uVar4;
  
  pcVar2 = strchr(arg,0x43);
  pcVar3 = strchr(arg,99);
  uVar4 = (pcVar2 != (char *)0x0) + 0x200;
  if (pcVar3 == (char *)0x0) {
    uVar4 = (uint)(pcVar2 != (char *)0x0);
  }
  pcVar2 = strchr(arg,100);
  uVar1 = uVar4 + 2;
  if (pcVar2 == (char *)0x0) {
    uVar1 = uVar4;
  }
  pcVar2 = strchr(arg,0x6c);
  uVar4 = uVar1 + 0x100;
  if (pcVar2 == (char *)0x0) {
    uVar4 = uVar1;
  }
  pcVar2 = strchr(arg,0x75);
  uVar1 = uVar4 | 8;
  if (pcVar2 == (char *)0x0) {
    uVar1 = uVar4;
  }
  return uVar1;
}

Assistant:

static zip_flags_t
get_flags(const char *arg) {
    zip_flags_t flags = 0;
    if (strchr(arg, 'C') != NULL)
	flags |= ZIP_FL_NOCASE;
    if (strchr(arg, 'c') != NULL)
	flags |= ZIP_FL_CENTRAL;
    if (strchr(arg, 'd') != NULL)
	flags |= ZIP_FL_NODIR;
    if (strchr(arg, 'l') != NULL)
	flags |= ZIP_FL_LOCAL;
    if (strchr(arg, 'u') != NULL)
	flags |= ZIP_FL_UNCHANGED;
    return flags;
}